

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O0

Qiniu_Error Qiniu_Qetag_DigestFile(char *localFile,char **digest)

{
  char *buf_00;
  Qiniu_Error QVar1;
  undefined4 uStack_94;
  undefined4 uStack_84;
  undefined4 uStack_74;
  undefined4 uStack_64;
  char *buf;
  _Qiniu_Qetag_Context *ctx;
  Qiniu_File *f;
  ssize_t readBytes;
  size_t readingBytes;
  Qiniu_Off_T offset;
  char **digest_local;
  char *localFile_local;
  Qiniu_Error err;
  
  readingBytes = 0;
  readBytes = 0x100000;
  f = (Qiniu_File *)0x0;
  ctx = (_Qiniu_Qetag_Context *)0x0;
  buf = (char *)0x0;
  offset = (Qiniu_Off_T)digest;
  digest_local = (char **)localFile;
  buf_00 = (char *)malloc(0x100000);
  if (buf_00 == (char *)0x0) {
    localFile_local = (char *)0x270f;
    err._0_8_ = anon_var_dwarf_baf3;
  }
  else {
    QVar1 = Qiniu_Qetag_New((_Qiniu_Qetag_Context **)&buf,1);
    err._0_8_ = QVar1.message;
    localFile_local = (char *)CONCAT44(uStack_64,QVar1.code);
    if (QVar1.code == 200) {
      QVar1 = Qiniu_File_Open((Qiniu_File **)&ctx,(char *)digest_local);
      err._0_8_ = QVar1.message;
      localFile_local = (char *)CONCAT44(uStack_74,QVar1.code);
      if (QVar1.code == 200) {
        do {
          f = (Qiniu_File *)Qiniu_File_ReadAt(ctx,buf_00,readBytes,readingBytes);
          if ((long)f < 0) {
            localFile_local = (char *)CONCAT44(localFile_local._4_4_,0x2706);
            err._0_8_ = anon_var_dwarf_bb0a;
            goto LAB_0011bde1;
          }
          if (0 < (long)f) {
            QVar1 = Qiniu_Qetag_Update((_Qiniu_Qetag_Context *)buf,buf_00,(size_t)f);
            err._0_8_ = QVar1.message;
            localFile_local = (char *)CONCAT44(uStack_84,QVar1.code);
            if (QVar1.code != 200) goto LAB_0011bde1;
            readingBytes = (size_t)(f + readingBytes);
          }
        } while (0 < (long)f);
        QVar1 = Qiniu_Qetag_Final((_Qiniu_Qetag_Context *)buf,(char **)offset);
        err._0_8_ = QVar1.message;
        localFile_local = (char *)CONCAT44(uStack_94,QVar1.code);
LAB_0011bde1:
        Qiniu_File_Close(ctx);
      }
      Qiniu_Qetag_Destroy((_Qiniu_Qetag_Context *)buf);
    }
    free(buf_00);
  }
  QVar1._0_8_ = (ulong)localFile_local & 0xffffffff;
  QVar1.message = (char *)err._0_8_;
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_Qetag_DigestFile(const char * localFile, char ** digest)
{
    Qiniu_Error err;
    Qiniu_Off_T offset = 0;
    size_t readingBytes = (BLOCK_MAX_SIZE >> 2);
    ssize_t readBytes = 0;
	Qiniu_File * f = NULL;
    struct _Qiniu_Qetag_Context * ctx = NULL;
    char * buf = NULL;

    // 1MB buffer
    buf = malloc(readingBytes);
    if (!buf) {
        err.code = 9999;
        err.message = "no enough memory";
        return err;
    }

    err = Qiniu_Qetag_New(&ctx, 1);
    if (err.code != 200) {
        goto DIGESTFILE_NEWCTX_ERROR;
    }

	err = Qiniu_File_Open(&f, localFile);
	if (err.code != 200) {
        goto DIGESTFILE_OPEN_ERROR;
	}

    do {
        readBytes = Qiniu_File_ReadAt(f, buf, readingBytes, offset);
        if (readBytes < 0) {
            err.code = 9990;
            err.message = "failed in reading file";
            goto DIGESTFILE_UPDATE_ERROR;
        } else if (readBytes > 0) {
            err = Qiniu_Qetag_Update(ctx, buf, readBytes);
            if (err.code != 200) {
                goto DIGESTFILE_UPDATE_ERROR;
            }
            offset += readBytes;
        } // if
    } while(readBytes > 0);

    err = Qiniu_Qetag_Final(ctx, digest);

DIGESTFILE_UPDATE_ERROR:
    Qiniu_File_Close(f);

DIGESTFILE_OPEN_ERROR:
    Qiniu_Qetag_Destroy(ctx);

DIGESTFILE_NEWCTX_ERROR:
    free(buf);

    return err;
}